

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t nw_out_writer(void *writer_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  Curl_easy *local_50;
  ssize_t nwritten;
  Curl_easy *data;
  Curl_cfilter *cf;
  CURLcode *err_local;
  size_t buflen_local;
  uchar *buf_local;
  void *writer_ctx_local;
  
  if (writer_ctx == (void *)0x0) {
    local_50 = (Curl_easy *)0x0;
  }
  else {
    local_50 = *(Curl_easy **)(*(long *)((long)writer_ctx + 0x10) + 0x10);
  }
  if (local_50 == (Curl_easy *)0x0) {
    writer_ctx_local = (void *)0x0;
  }
  else {
    writer_ctx_local =
         (void *)Curl_conn_cf_send(*(Curl_cfilter **)((long)writer_ctx + 8),local_50,buf,buflen,err)
    ;
    if ((((0 < (long)writer_ctx_local) && (local_50 != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(local_50->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((writer_ctx != (void *)0x0 && (0 < *(int *)(*writer_ctx + 0xc))))) {
      Curl_trc_cf_infof(local_50,(Curl_cfilter *)writer_ctx,"[0] egress: wrote %zd bytes",
                        writer_ctx_local);
    }
  }
  return (ssize_t)writer_ctx_local;
}

Assistant:

static ssize_t nw_out_writer(void *writer_ctx,
                             const unsigned char *buf, size_t buflen,
                             CURLcode *err)
{
  struct Curl_cfilter *cf = writer_ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);

  if(data) {
    ssize_t nwritten = Curl_conn_cf_send(cf->next, data,
                                         (const char *)buf, buflen, err);
    if(nwritten > 0)
      CURL_TRC_CF(data, cf, "[0] egress: wrote %zd bytes", nwritten);
    return nwritten;
  }
  return 0;
}